

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_char)>::PerformDefaultAction
          (FunctionMockerBase<void_(unsigned_short,_unsigned_char)> *this,type args,
          string *call_description)

{
  bool bVar1;
  OnCallSpec<void_(unsigned_short,_unsigned_char)> *this_00;
  Action<void_(unsigned_short,_unsigned_char)> *this_01;
  runtime_error *this_02;
  undefined1 local_50 [8];
  string message;
  OnCallSpec<void_(unsigned_short,_unsigned_char)> *spec;
  string *call_description_local;
  type args_local;
  FunctionMockerBase<void_(unsigned_short,_unsigned_char)> *this_local;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<void_(unsigned_short,_unsigned_char)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<void>::Exists();
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)local_50);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    DefaultValue<void>::Get();
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    this_01 = OnCallSpec<void_(unsigned_short,_unsigned_char)>::GetAction(this_00);
    std::tuple<unsigned_short,_unsigned_char>::tuple
              ((tuple<unsigned_short,_unsigned_char> *)((long)&message.field_2 + 0xc),args);
    Action<void_(unsigned_short,_unsigned_char)>::Perform
              (this_01,(ArgumentTuple *)((long)&message.field_2 + 0xc));
  }
  return;
}

Assistant:

Result PerformDefaultAction(
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args,
      const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(internal::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }